

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_24::CSharpCodeGenerator::GenerateMakeRule
          (CSharpCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  string local_50;
  string *local_30;
  string *output_local;
  string *filename_local;
  string *path_local;
  Parser *parser_local;
  CSharpCodeGenerator *this_local;
  
  local_30 = output;
  output_local = filename;
  filename_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  JavaCSharpMakeRule(&local_50,false,parser,path,filename);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = JavaCSharpMakeRule(false, parser, path, filename);
    return Status::OK;
  }